

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_ctx_open(nni_ctx **ctxp,nni_sock *sock)

{
  size_t sz_00;
  nni_ctx *ctx_00;
  size_t sz;
  int rv;
  nni_ctx *ctx;
  nni_sock *sock_local;
  nni_ctx **ctxp_local;
  
  if ((sock->s_ctx_ops).ctx_init == (_func_void_void_ptr_void_ptr *)0x0) {
    ctxp_local._4_4_ = 9;
  }
  else {
    sz_00 = (sock->s_ctx_ops).ctx_size + 0x70;
    ctx_00 = (nni_ctx *)nni_zalloc(sz_00);
    if (ctx_00 == (nni_ctx *)0x0) {
      ctxp_local._4_4_ = 2;
    }
    else {
      ctx_00->c_size = sz_00;
      ctx_00->c_data = ctx_00 + 1;
      ctx_00->c_closed = false;
      ctx_00->c_ref = 1;
      ctx_00->c_sock = sock;
      memcpy(&ctx_00->c_ops,&sock->s_ctx_ops,0x30);
      ctx_00->c_rcvtimeo = sock->s_rcvtimeo;
      ctx_00->c_sndtimeo = sock->s_sndtimeo;
      nni_mtx_lock(&sock_lk);
      if ((sock->s_closed & 1U) == 0) {
        ctxp_local._4_4_ = nni_id_alloc32(&ctx_ids,&ctx_00->c_id,ctx_00);
        if (ctxp_local._4_4_ == 0) {
          (*(sock->s_ctx_ops).ctx_init)(ctx_00->c_data,sock->s_data);
          nni_list_append(&sock->s_ctxs,ctx_00);
          nni_mtx_unlock(&sock_lk);
          nni_mtx_lock(&sock->s_mx);
          if ((sock->s_closing & 1U) == 0) {
            nni_mtx_unlock(&sock->s_mx);
            *ctxp = ctx_00;
            ctxp_local._4_4_ = 0;
          }
          else {
            nni_mtx_unlock(&sock->s_mx);
            nni_ctx_rele(ctx_00);
            ctxp_local._4_4_ = 7;
          }
        }
        else {
          nni_mtx_unlock(&sock_lk);
          nni_free(ctx_00,ctx_00->c_size);
        }
      }
      else {
        nni_mtx_unlock(&sock_lk);
        nni_free(ctx_00,ctx_00->c_size);
        ctxp_local._4_4_ = 7;
      }
    }
  }
  return ctxp_local._4_4_;
}

Assistant:

int
nni_ctx_open(nni_ctx **ctxp, nni_sock *sock)
{
	nni_ctx *ctx;
	int      rv;
	size_t   sz;

	if (sock->s_ctx_ops.ctx_init == NULL) {
		return (NNG_ENOTSUP);
	}

	sz = NNI_ALIGN_UP(sizeof(*ctx)) + sock->s_ctx_ops.ctx_size;
	if ((ctx = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	ctx->c_size     = sz;
	ctx->c_data     = ctx + 1;
	ctx->c_closed   = false;
	ctx->c_ref      = 1; // Caller implicitly gets a reference.
	ctx->c_sock     = sock;
	ctx->c_ops      = sock->s_ctx_ops;
	ctx->c_rcvtimeo = sock->s_rcvtimeo;
	ctx->c_sndtimeo = sock->s_sndtimeo;

	nni_mtx_lock(&sock_lk);
	if (sock->s_closed) {
		nni_mtx_unlock(&sock_lk);
		nni_free(ctx, ctx->c_size);
		return (NNG_ECLOSED);
	}
	if ((rv = nni_id_alloc32(&ctx_ids, &ctx->c_id, ctx)) != 0) {
		nni_mtx_unlock(&sock_lk);
		nni_free(ctx, ctx->c_size);
		return (rv);
	}

	sock->s_ctx_ops.ctx_init(ctx->c_data, sock->s_data);

	nni_list_append(&sock->s_ctxs, ctx);
	nni_mtx_unlock(&sock_lk);

	// Paranoia, fixing a possible race in close.  Don't let us
	// give back a context if the socket is being shutdown (it
	// might not have reached the "closed" state yet.)
	nni_mtx_lock(&sock->s_mx);
	if (sock->s_closing) {
		nni_mtx_unlock(&sock->s_mx);
		nni_ctx_rele(ctx);
		return (NNG_ECLOSED);
	}
	nni_mtx_unlock(&sock->s_mx);
	*ctxp = ctx;

	return (0);
}